

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

int Acb_ObjPushToFanins(Acb_Ntk_t *p,int iObj,int nLutSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  word *pwVar22;
  word *pwVar23;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  iVar1 = (p->vObjFans).nSize;
  if (iObj < iVar1) {
    piVar6 = (p->vObjFans).pArray;
    lVar14 = (long)piVar6[(uint)iObj];
    if ((lVar14 < 0) || (iVar2 = (p->vFanSto).nSize, iVar2 <= piVar6[(uint)iObj])) {
LAB_00382fda:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    piVar7 = (p->vFanSto).pArray;
    uVar19 = (ulong)piVar7[lVar14];
    iVar10 = 0;
    if (1 < (long)uVar19) {
      uVar11 = 0;
      do {
        iVar10 = piVar7[lVar14 + uVar11 + 1];
        lVar18 = (long)iVar10;
        if (lVar18 < 1) goto LAB_00382f5e;
        iVar3 = (p->vObjType).nSize;
        if (iVar3 <= iVar10) goto LAB_00382f7d;
        pcVar8 = (p->vObjType).pArray;
        if (pcVar8[lVar18] != '\x03') {
          if ((p->vFanouts).nSize <= iVar10) goto LAB_00382ff9;
          if ((p->vFanouts).pArray[lVar18].nSize < 2) {
            if (iVar1 <= iVar10) goto LAB_00383018;
            iVar4 = piVar6[lVar18];
            if (((long)iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_00382fda;
            if (piVar7[iVar4] != nLutSize) {
              pwVar23 = s_Truths6;
              pwVar22 = s_Truths6Neg;
              uVar20 = 0;
              do {
                if (uVar11 != uVar20) {
                  uVar5 = (p->vObjTruth).nSize;
                  if ((int)uVar5 < 1) goto LAB_00382f9c;
                  if (uVar5 <= (uint)iObj) goto LAB_00382fbb;
                  if ((5 < uVar20) || (5 < uVar11)) {
                    __assert_fail("iVar >= 0 && iVar < 6",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                  ,0x240,"word Abc_Tt6Cofactor0(word, int)");
                  }
                  uVar15 = (p->vObjTruth).pArray[(uint)iObj];
                  uVar17 = *pwVar23 & uVar15;
                  bVar12 = (byte)(1 << ((byte)uVar20 & 0x1f));
                  uVar15 = uVar15 & *pwVar22;
                  uVar15 = uVar15 << (bVar12 & 0x3f) | uVar15;
                  uVar21 = uVar15 & s_Truths6Neg[uVar11];
                  bVar13 = (byte)(1 << ((byte)uVar11 & 0x1f));
                  uVar17 = uVar17 >> (bVar12 & 0x3f) | uVar17;
                  uVar15 = uVar15 & s_Truths6[uVar11];
                  uVar21 = uVar21 << (bVar13 & 0x3f) | uVar21;
                  uVar15 = uVar15 >> (bVar13 & 0x3f) | uVar15;
                  uVar16 = s_Truths6Neg[uVar11] & uVar17;
                  uVar16 = uVar16 << (bVar13 & 0x3f) | uVar16;
                  uVar17 = uVar17 & s_Truths6[uVar11];
                  if (((uVar21 != uVar15) || (uVar21 != uVar16)) &&
                     ((uVar17 = uVar17 >> (bVar13 & 0x3f) | uVar17, uVar17 != uVar21 ||
                      (uVar17 != uVar16)))) {
                    if ((uVar17 != uVar15 || uVar17 != uVar16 && uVar17 != uVar21) &&
                       (uVar17 != uVar21 || uVar15 != uVar16)) goto LAB_00382db2;
                  }
                  Acb_ObjPushToFanin(p,iObj,(int)uVar20,iVar10);
                  goto LAB_00382f2b;
                }
LAB_00382db2:
                uVar20 = uVar20 + 1;
                pwVar22 = pwVar22 + 1;
                pwVar23 = pwVar23 + 1;
              } while (uVar19 != uVar20);
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar19);
      iVar10 = 0;
      if (piVar7[lVar14] == 2) {
        if ((p->vFanouts).nSize <= iObj) {
LAB_00382ff9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar9 = (p->vFanouts).pArray;
        if (pVVar9[(uint)iObj].nSize == 1) {
          iVar4 = *pVVar9[(uint)iObj].pArray;
          lVar14 = (long)iVar4;
          if (lVar14 < 1) {
LAB_00382f5e:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if (iVar3 <= iVar4) {
LAB_00382f7d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (pcVar8[lVar14] != '\x04') {
            if (iVar1 <= iVar4) goto LAB_00383018;
            iVar1 = piVar6[lVar14];
            if (((long)iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_00382fda;
            if (piVar7[iVar1] < nLutSize) {
              uVar5 = (p->vObjTruth).nSize;
              if ((int)uVar5 < 1) {
LAB_00382f9c:
                __assert_fail("Acb_NtkHasObjTruths(p)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                              ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
              }
              if (uVar5 <= (uint)iObj) {
LAB_00382fbb:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                              ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              uVar19 = (p->vObjTruth).pArray[(uint)iObj];
              lVar18 = 0;
              lVar14 = 0;
              do {
                uVar11 = *(ulong *)((long)s_Truths6Neg + lVar18) & uVar19;
                bVar12 = (byte)(1 << ((byte)lVar14 & 0x1f));
                uVar20 = *(ulong *)((long)s_Truths6 + lVar18) & uVar19;
                uVar11 = uVar11 << (bVar12 & 0x3f) | uVar11;
                uVar20 = uVar20 >> (bVar12 & 0x3f) | uVar20;
                if (uVar11 == uVar20) {
                  __assert_fail("c0 != c1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                                ,0x95b,"int Abc_Tt6CheckOutDec(word, int, word *)");
                }
                if ((((uVar20 ^ uVar11) == 0xffffffffffffffff) || (uVar11 + 1 < 2)) ||
                   (uVar20 + 1 < 2)) goto LAB_00382f0d;
                lVar14 = lVar14 + 1;
                lVar18 = lVar18 + 8;
              } while (lVar14 != 2);
              lVar14 = 0xffffffff;
LAB_00382f0d:
              Acb_ObjPushToFanout(p,iObj,(int)lVar14,iVar4);
LAB_00382f2b:
              iVar10 = 1;
            }
          }
        }
      }
    }
    return iVar10;
  }
LAB_00383018:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_ObjPushToFanins( Acb_Ntk_t * p, int iObj, int nLutSize )
{
    int k, k2, iFanin, * pFanins;
    if ( Acb_ObjFaninNum(p, iObj) < 2 )
        return 0;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Acb_ObjIsCi(p, iFanin) )
            continue;
        if ( Acb_ObjFanoutNum(p, iFanin) > 1 )
            continue;
        if ( Acb_ObjFaninNum(p, iFanin) == nLutSize )
            continue;
        if ( (k2 = Acb_ObjFindFaninPushableIndex(p, iObj, k)) == -1 )
            continue;
        //printf( "Object %4d : Pushing fanin %d (%d) into fanin %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanin );
        Acb_ObjPushToFanin( p, iObj, k2, iFanin );
        return 1;
    }
    if ( Acb_ObjFaninNum(p, iObj) == 2 && Acb_ObjFanoutNum(p, iObj) == 1 )
    {
        int iFanout = Acb_ObjFanout( p, iObj, 0 );
        if ( !Acb_ObjIsCo(p, iFanout) && Acb_ObjFaninNum(p, iFanout) < nLutSize )
        {
            k2 = Acb_ObjFindFanoutPushableIndex( p, iObj );
            //printf( "Object %4d : Pushing fanin %d (%d) into fanout %d.\n", iObj, Acb_ObjFanin(p, iObj, k2), k2, iFanout );
            Acb_ObjPushToFanout( p, iObj, k2, iFanout );
            return 1;
        }
    }
    return 0;
}